

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

int EmitPartitionsSize(VP8Encoder *enc,WebPPicture *pic)

{
  int iVar1;
  size_t sVar2;
  WebPPicture *in_RSI;
  long in_RDI;
  size_t part_size;
  int p;
  uint8_t buf [21];
  int local_3c;
  uint8_t local_38 [32];
  WebPPicture *local_18;
  long local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_3c = 0; local_3c < *(int *)(local_10 + 0x3c) + -1; local_3c = local_3c + 1) {
    sVar2 = VP8BitWriterSize((VP8BitWriter *)(local_10 + 0x70 + (long)local_3c * 0x30));
    if (0xffffff < sVar2) {
      iVar1 = WebPEncodingSetError(local_18,VP8_ENC_ERROR_PARTITION_OVERFLOW);
      return iVar1;
    }
    local_38[local_3c * 3] = (uint8_t)sVar2;
    local_38[local_3c * 3 + 1] = (uint8_t)(sVar2 >> 8);
    local_38[local_3c * 3 + 2] = (uint8_t)(sVar2 >> 0x10);
  }
  if ((local_3c != 0) &&
     (iVar1 = (*local_18->writer)(local_38,(long)(local_3c * 3),local_18), iVar1 == 0)) {
    iVar1 = WebPEncodingSetError(local_18,VP8_ENC_ERROR_BAD_WRITE);
    return iVar1;
  }
  return 1;
}

Assistant:

static int EmitPartitionsSize(const VP8Encoder* const enc,
                              WebPPicture* const pic) {
  uint8_t buf[3 * (MAX_NUM_PARTITIONS - 1)];
  int p;
  for (p = 0; p < enc->num_parts - 1; ++p) {
    const size_t part_size = VP8BitWriterSize(enc->parts + p);
    if (part_size >= VP8_MAX_PARTITION_SIZE) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_PARTITION_OVERFLOW);
    }
    buf[3 * p + 0] = (part_size >>  0) & 0xff;
    buf[3 * p + 1] = (part_size >>  8) & 0xff;
    buf[3 * p + 2] = (part_size >> 16) & 0xff;
  }
  if (p && !pic->writer(buf, 3 * p, pic)) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  }
  return 1;
}